

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::UndoBuffer::Commit(UndoBuffer *this,IteratorState *iterator_state,transaction_t commit_id)

{
  optional_ptr<duckdb::UndoBufferEntry,_true> *this_00;
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoBufferEntry *pUVar3;
  data_ptr_t pdVar4;
  UndoFlags *pUVar5;
  UndoFlags *pUVar6;
  CommitState state;
  CommitState local_58;
  BufferHandle local_48;
  
  CommitState::CommitState(&local_58,this->transaction,commit_id);
  pUVar3 = (this->allocator).tail.ptr;
  this_00 = &iterator_state->current;
  (iterator_state->current).ptr = pUVar3;
  while (pUVar3 != (UndoBufferEntry *)0x0) {
    pBVar2 = (this->allocator).buffer_manager;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&pUVar3->block);
    BufferHandle::operator=(&iterator_state->handle,&local_48);
    BufferHandle::~BufferHandle(&local_48);
    pdVar4 = BufferHandle::Ptr(&iterator_state->handle);
    iterator_state->start = pdVar4;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    pUVar5 = (UndoFlags *)(pdVar4 + pUVar3->position);
    iterator_state->end = (data_ptr_t)pUVar5;
    pUVar6 = (UndoFlags *)iterator_state->start;
    while (pUVar6 < pUVar5) {
      type = *pUVar6;
      iterator_state->start = (data_ptr_t)(pUVar6 + 1);
      UVar1 = pUVar6[1];
      iterator_state->start = (data_ptr_t)(pUVar6 + 2);
      CommitState::CommitEntry(&local_58,type,(data_ptr_t)(pUVar6 + 2));
      pUVar6 = (UndoFlags *)(iterator_state->start + UVar1);
      iterator_state->start = (data_ptr_t)pUVar6;
      pUVar5 = (UndoFlags *)iterator_state->end;
    }
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    pUVar3 = (pUVar3->prev).ptr;
    this_00->ptr = pUVar3;
  }
  return;
}

Assistant:

void UndoBuffer::Commit(UndoBuffer::IteratorState &iterator_state, transaction_t commit_id) {
	CommitState state(transaction, commit_id);
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CommitEntry(type, data); });
}